

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<double> *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  double v;
  storage_t<double> local_18;
  
  local_18._1_7_ = in_register_00000001;
  local_18._0_1_ = in_AL;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(double *)&local_18);
    if ((bVar1) && (value->contained = local_18, value->has_value_ == false)) {
      value->has_value_ = true;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<double> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  double v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}